

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O2

void __thiscall EvalString::AddSpecial(EvalString *this,StringPiece text)

{
  string local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>
  local_48;
  StringPiece local_20;
  
  local_20.len_ = text.len_;
  local_20.str_ = text.str_;
  StringPiece::AsString_abi_cxx11_(&local_68,&local_20);
  local_48.first._M_string_length = local_68._M_string_length;
  local_48.first._M_dataplus._M_p = (pointer)&local_48.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    local_48.first.field_2._8_8_ = local_68.field_2._8_8_;
  }
  else {
    local_48.first._M_dataplus._M_p = local_68._M_dataplus._M_p;
  }
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_48.second = SPECIAL;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::
  vector<std::pair<std::__cxx11::string,EvalString::TokenType>,std::allocator<std::pair<std::__cxx11::string,EvalString::TokenType>>>
  ::emplace_back<std::pair<std::__cxx11::string,EvalString::TokenType>>
            ((vector<std::pair<std::__cxx11::string,EvalString::TokenType>,std::allocator<std::pair<std::__cxx11::string,EvalString::TokenType>>>
              *)this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void EvalString::AddSpecial(StringPiece text) {
  parsed_.push_back(make_pair(text.AsString(), SPECIAL));
}